

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest_SourcesAndNames_Test::TestBody(SourceMapTest_SourcesAndNames_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  int local_d4;
  size_type local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  int local_64;
  size_type local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string sourceMap;
  SourceMapTest_SourcesAndNames_Test *this_local;
  
  sourceMap.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\n    {\n      \"version\": 3,\n      \"sources\": [\"foo.c\", \"bar.c\"],\n      \"names\": [\"foo\", \"bar\"],\n      \"mappings\": \"\"\n    }\n  "
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  SourceMapTest::parseMap(&this->super_SourceMapTest,(string *)local_30);
  local_60 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&(this->super_SourceMapTest).wasm.debugInfoFileNames);
  local_64 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_58,"wasm.debugInfoFileNames.size()","2",&local_60,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_SourceMapTest).wasm.debugInfoFileNames,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_88,"wasm.debugInfoFileNames[0]","\"foo.c\"",pvVar3,
             (char (*) [6])"foo.c");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_SourceMapTest).wasm.debugInfoFileNames,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_a8,"wasm.debugInfoFileNames[1]","\"bar.c\"",pvVar3,
             (char (*) [6])"bar.c");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d0 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&(this->super_SourceMapTest).wasm.debugInfoSymbolNames);
  local_d4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"wasm.debugInfoSymbolNames.size()","2",&local_d0,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_SourceMapTest).wasm.debugInfoSymbolNames,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_f8,"wasm.debugInfoSymbolNames[0]","\"foo\"",pvVar3,
             (char (*) [4])"foo");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_SourceMapTest).wasm.debugInfoSymbolNames,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_118,"wasm.debugInfoSymbolNames[1]","\"bar\"",pvVar3,
             (char (*) [4])0x4a27fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourcesAndNames) {
  std::string sourceMap = R"(
    {
      "version": 3,
      "sources": ["foo.c", "bar.c"],
      "names": ["foo", "bar"],
      "mappings": ""
    }
  )";
  parseMap(sourceMap);

  EXPECT_EQ(wasm.debugInfoFileNames.size(), 2);
  EXPECT_EQ(wasm.debugInfoFileNames[0], "foo.c");
  EXPECT_EQ(wasm.debugInfoFileNames[1], "bar.c");
  EXPECT_EQ(wasm.debugInfoSymbolNames.size(), 2);
  EXPECT_EQ(wasm.debugInfoSymbolNames[0], "foo");
  EXPECT_EQ(wasm.debugInfoSymbolNames[1], "bar");
}